

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

void __thiscall
llvm::
DenseMapBase<llvm::DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>,_unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
::moveFromOldBuckets
          (DenseMapBase<llvm::DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>,_unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
           *this,DenseMapPair<unsigned_long,_unsigned_long> *OldBucketsBegin,
          DenseMapPair<unsigned_long,_unsigned_long> *OldBucketsEnd)

{
  unsigned_long uVar1;
  bool bVar2;
  unsigned_long *puVar3;
  unsigned_long *puVar4;
  DenseMapPair<unsigned_long,_unsigned_long> *pDStack_48;
  bool FoundVal;
  DenseMapPair<unsigned_long,_unsigned_long> *DestBucket;
  DenseMapPair<unsigned_long,_unsigned_long> *E;
  DenseMapPair<unsigned_long,_unsigned_long> *B;
  unsigned_long TombstoneKey;
  unsigned_long EmptyKey;
  DenseMapPair<unsigned_long,_unsigned_long> *OldBucketsEnd_local;
  DenseMapPair<unsigned_long,_unsigned_long> *OldBucketsBegin_local;
  DenseMapBase<llvm::DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>,_unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
  *this_local;
  
  EmptyKey = (unsigned_long)OldBucketsEnd;
  OldBucketsEnd_local = OldBucketsBegin;
  OldBucketsBegin_local = (DenseMapPair<unsigned_long,_unsigned_long> *)this;
  initEmpty(this);
  TombstoneKey = getEmptyKey();
  B = (DenseMapPair<unsigned_long,_unsigned_long> *)getTombstoneKey();
  E = OldBucketsEnd_local;
  DestBucket = (DenseMapPair<unsigned_long,_unsigned_long> *)EmptyKey;
  do {
    if (E == DestBucket) {
      return;
    }
    puVar3 = detail::DenseMapPair<unsigned_long,_unsigned_long>::getFirst(E);
    bVar2 = DenseMapInfo<unsigned_long>::isEqual(puVar3,&TombstoneKey);
    if (!bVar2) {
      puVar3 = detail::DenseMapPair<unsigned_long,_unsigned_long>::getFirst(E);
      bVar2 = DenseMapInfo<unsigned_long>::isEqual(puVar3,(unsigned_long *)&B);
      if (!bVar2) {
        puVar3 = detail::DenseMapPair<unsigned_long,_unsigned_long>::getFirst(E);
        bVar2 = LookupBucketFor<unsigned_long>(this,puVar3,&stack0xffffffffffffffb8);
        if (bVar2) {
          __assert_fail("!FoundVal && \"Key already in new map?\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/DenseMap.h"
                        ,0x17a,
                        "void llvm::DenseMapBase<llvm::DenseMap<unsigned long, unsigned long>, unsigned long, unsigned long, llvm::DenseMapInfo<unsigned long>, llvm::detail::DenseMapPair<unsigned long, unsigned long>>::moveFromOldBuckets(BucketT *, BucketT *) [DerivedT = llvm::DenseMap<unsigned long, unsigned long>, KeyT = unsigned long, ValueT = unsigned long, KeyInfoT = llvm::DenseMapInfo<unsigned long>, BucketT = llvm::detail::DenseMapPair<unsigned long, unsigned long>]"
                       );
        }
        puVar3 = detail::DenseMapPair<unsigned_long,_unsigned_long>::getFirst(E);
        uVar1 = *puVar3;
        puVar3 = detail::DenseMapPair<unsigned_long,_unsigned_long>::getFirst(pDStack_48);
        *puVar3 = uVar1;
        puVar3 = detail::DenseMapPair<unsigned_long,_unsigned_long>::getSecond(pDStack_48);
        puVar4 = detail::DenseMapPair<unsigned_long,_unsigned_long>::getSecond(E);
        *puVar3 = *puVar4;
        incrementNumEntries(this);
        detail::DenseMapPair<unsigned_long,_unsigned_long>::getSecond(E);
      }
    }
    detail::DenseMapPair<unsigned_long,_unsigned_long>::getFirst(E);
    E = E + 1;
  } while( true );
}

Assistant:

void moveFromOldBuckets(BucketT *OldBucketsBegin, BucketT *OldBucketsEnd) {
    initEmpty();

    // Insert all the old elements.
    const KeyT EmptyKey = getEmptyKey();
    const KeyT TombstoneKey = getTombstoneKey();
    for (BucketT *B = OldBucketsBegin, *E = OldBucketsEnd; B != E; ++B) {
      if (!KeyInfoT::isEqual(B->getFirst(), EmptyKey) &&
          !KeyInfoT::isEqual(B->getFirst(), TombstoneKey)) {
        // Insert the key/value into the new table.
        BucketT *DestBucket;
        bool FoundVal = LookupBucketFor(B->getFirst(), DestBucket);
        (void)FoundVal; // silence warning.
        assert(!FoundVal && "Key already in new map?");
        DestBucket->getFirst() = std::move(B->getFirst());
        ::new (&DestBucket->getSecond()) ValueT(std::move(B->getSecond()));
        incrementNumEntries();

        // Free the value.
        B->getSecond().~ValueT();
      }
      B->getFirst().~KeyT();
    }
  }